

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLComment::~XMLComment(XMLComment *this)

{
  XMLNode *this_00;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00275560;
  XMLNode::DeleteChildren(&this->super_XMLNode);
  this_00 = (this->super_XMLNode)._parent;
  if (this_00 != (XMLNode *)0x0) {
    XMLNode::Unlink(this_00,&this->super_XMLNode);
  }
  StrPair::Reset(&(this->super_XMLNode)._value);
  return;
}

Assistant:

XMLNode::~XMLNode()
{
    DeleteChildren();
    if ( _parent ) {
        _parent->Unlink( this );
    }
}